

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O3

void ecs_strbuf_grow_str(ecs_strbuf_t *b,char *str,char *alloc_str,int32_t size)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ecs_strbuf_element *peVar4;
  ecs_strbuf_element *peVar5;
  size_t sVar6;
  
  peVar5 = (ecs_strbuf_element *)(*ecs_os_api.malloc_)(0x20);
  peVar4 = b->current;
  peVar4->next = peVar5;
  iVar1 = peVar4->pos;
  b->current = peVar5;
  uVar2 = b->size;
  uVar3 = b->elementCount;
  b->size = iVar1 + uVar2;
  b->elementCount = uVar3 + 1;
  peVar5->buffer_embedded = false;
  if (size == 0) {
    sVar6 = strlen(str);
    size = (int32_t)sVar6;
  }
  peVar5->pos = size;
  peVar5->next = (ecs_strbuf_element *)0x0;
  peVar5->buf = str;
  *(char **)(peVar5 + 1) = alloc_str;
  return;
}

Assistant:

static
void ecs_strbuf_grow_str(
    ecs_strbuf_t *b,
    char *str,
    char *alloc_str,
    int32_t size)
{
    /* Allocate new element */
    ecs_strbuf_element_str *e = ecs_os_malloc(sizeof(ecs_strbuf_element_str));
    b->size += b->current->pos;
    b->current->next = (ecs_strbuf_element*)e;
    b->current = (ecs_strbuf_element*)e;
    b->elementCount ++;
    e->super.buffer_embedded = false;
    e->super.pos = size ? size : (int32_t)ecs_os_strlen(str);
    e->super.next = NULL;
    e->super.buf = str;
    e->alloc_str = alloc_str;
}